

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestString.cpp
# Opt level: O1

void __thiscall UnitTest_string1::Run(UnitTest_string1 *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  int iVar4;
  String str2;
  String str1;
  string local_d0;
  string local_b0;
  String local_90;
  String local_58;
  
  luna::String::String(&local_58,"abc");
  luna::String::String(&local_90,"abc");
  bVar3 = luna::operator==(&local_58,&local_90);
  if (!bVar3) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"\'str1 == str2\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  bVar3 = luna::operator<(&local_90,&local_58);
  if (bVar3) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"\'str1 <= str2\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  bVar3 = luna::operator<(&local_58,&local_90);
  if (bVar3) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"\'str1 >= str2\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  if (local_58.hash_ != local_90.hash_) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"\'str1.GetHash() == str2.GetHash()\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  if (local_58.length_ != local_90.length_) {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"\'str1.GetLength() == str2.GetLength()\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  luna::String::GetStdString_abi_cxx11_(&local_d0,&local_58);
  luna::String::GetStdString_abi_cxx11_(&local_b0,&local_90);
  if (local_d0._M_string_length == local_b0._M_string_length) {
    if (local_d0._M_string_length == 0) {
      bVar3 = true;
    }
    else {
      iVar4 = bcmp(local_d0._M_dataplus._M_p,local_b0._M_dataplus._M_p,local_d0._M_string_length);
      bVar3 = iVar4 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  paVar1 = &local_b0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  paVar2 = &local_d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (!bVar3) {
    local_d0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"\'str1.GetStdString() == str2.GetStdString()\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  luna::String::SetValue(&local_58,"abcdefghijklmn");
  luna::String::SetValue(&local_90,"abcdefghijklmnopqrst");
  bVar3 = luna::operator==(&local_58,&local_90);
  if (bVar3) {
    local_d0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"\'str1 != str2\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  bVar3 = luna::operator<(&local_58,&local_90);
  if (!bVar3) {
    local_d0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"\'str1 < str2\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  bVar3 = luna::operator<(&local_58,&local_90);
  if (!bVar3) {
    local_d0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"\'str2 > str1\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  if (local_90.length_ <= local_58.length_) {
    local_d0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"\'str1.GetLength() < str2.GetLength()\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  luna::String::GetStdString_abi_cxx11_(&local_d0,&local_58);
  luna::String::GetStdString_abi_cxx11_(&local_b0,&local_90);
  bVar3 = true;
  if (local_d0._M_string_length == local_b0._M_string_length) {
    if (local_d0._M_string_length == 0) {
      bVar3 = false;
    }
    else {
      iVar4 = bcmp(local_d0._M_dataplus._M_p,local_b0._M_dataplus._M_p,local_d0._M_string_length);
      bVar3 = iVar4 != 0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (!bVar3) {
    local_d0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"\'str1.GetStdString() != str2.GetStdString()\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  luna::String::SetValue(&local_58,"abc");
  luna::String::SetValue(&local_90,"def");
  bVar3 = luna::operator==(&local_58,&local_90);
  if (bVar3) {
    local_d0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"\'str1 != str2\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  bVar3 = luna::operator<(&local_58,&local_90);
  if (!bVar3) {
    local_d0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"\'str1 < str2\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  bVar3 = luna::operator<(&local_58,&local_90);
  if (!bVar3) {
    local_d0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"\'str2 > str1\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  if (local_58.length_ != local_90.length_) {
    local_d0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"\'str1.GetLength() == str2.GetLength()\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  luna::String::GetStdString_abi_cxx11_(&local_d0,&local_58);
  luna::String::GetStdString_abi_cxx11_(&local_b0,&local_90);
  bVar3 = true;
  if (local_d0._M_string_length == local_b0._M_string_length) {
    if (local_d0._M_string_length == 0) {
      bVar3 = false;
    }
    else {
      iVar4 = bcmp(local_d0._M_dataplus._M_p,local_b0._M_dataplus._M_p,local_d0._M_string_length);
      bVar3 = iVar4 != 0;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if (!bVar3) {
    local_d0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d0,"\'str1.GetStdString() != str2.GetStdString()\'","");
    UnitTestBase::Error(&this->super_UnitTestBase,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
  }
  luna::String::~String(&local_90);
  luna::String::~String(&local_58);
  return;
}

Assistant:

TEST_CASE(string1)
{
    luna::String str1("abc");
    luna::String str2("abc");

    EXPECT_TRUE(str1 == str2);
    EXPECT_TRUE(str1 <= str2);
    EXPECT_TRUE(str1 >= str2);
    EXPECT_TRUE(str1.GetHash() == str2.GetHash());
    EXPECT_TRUE(str1.GetLength() == str2.GetLength());
    EXPECT_TRUE(str1.GetStdString() == str2.GetStdString());

    str1.SetValue("abcdefghijklmn");
    str2.SetValue("abcdefghijklmnopqrst");
    EXPECT_TRUE(str1 != str2);
    EXPECT_TRUE(str1 < str2);
    EXPECT_TRUE(str2 > str1);
    EXPECT_TRUE(str1.GetLength() < str2.GetLength());
    EXPECT_TRUE(str1.GetStdString() != str2.GetStdString());

    str1.SetValue("abc");
    str2.SetValue("def");
    EXPECT_TRUE(str1 != str2);
    EXPECT_TRUE(str1 < str2);
    EXPECT_TRUE(str2 > str1);
    EXPECT_TRUE(str1.GetLength() == str2.GetLength());
    EXPECT_TRUE(str1.GetStdString() != str2.GetStdString());
}